

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::UniformSimple::Run(UniformSimple *this)

{
  size_t sVar1;
  GLuint GVar2;
  uint uVar3;
  char *src_vs;
  char *src_fs;
  mapped_type *pmVar4;
  allocator<char> local_2d9;
  key_type local_2d8;
  undefined4 local_2b8;
  undefined4 local_2b4;
  GLint expected2 [13];
  allocator<char> local_279;
  key_type local_278;
  undefined4 local_258;
  undefined4 local_254;
  GLint expected [13];
  undefined8 uStack_218;
  GLenum props [13];
  allocator<char> local_1d9;
  string local_1d8 [39];
  allocator<char> local_1b1;
  string local_1b0 [39];
  allocator<char> local_189;
  string local_188 [39];
  allocator<char> local_161;
  key_type local_160;
  allocator<char> local_139;
  string local_138 [39];
  allocator<char> local_111;
  key_type local_110;
  allocator<char> local_e9;
  string local_e8 [39];
  allocator<char> local_c1;
  string local_c0 [32];
  undefined1 local_a0 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  indices;
  long error;
  string local_58 [32];
  string local_38 [36];
  GLuint local_14;
  UniformSimple *pUStack_10;
  GLuint program;
  UniformSimple *this_local;
  
  pUStack_10 = this;
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x15])();
  src_vs = (char *)std::__cxx11::string::c_str();
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x16])(local_58);
  src_fs = (char *)std::__cxx11::string::c_str();
  GVar2 = PIQBase::CreateProgram(&this->super_PIQBase,src_vs,src_fs,false);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  local_14 = GVar2;
  glu::CallLogWrapper::glBindAttribLocation
            (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,GVar2,0,
             "position");
  PIQBase::LinkProgram(&this->super_PIQBase,local_14);
  GVar2 = local_14;
  indices._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar3 = (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x14])
                    (this,(ulong)local_14,0x8b86);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,(ulong)GVar2,0x92e1,0x92f5,(ulong)uVar3);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xd])
            (this,(ulong)local_14,0x92e1,0x92f6,8,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
         *)local_a0);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"repos",&local_c1);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)GVar2,0x92e1,local_a0,local_c0,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e8,"recolor",&local_e9);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xf])
            (this,(ulong)GVar2,0x92e1,local_a0,local_e8,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"repos",&local_111);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_110);
  uVar3 = *pmVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_138,"repos",&local_139);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)GVar2,0x92e1,(ulong)uVar3,local_138,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_139);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"recolor",&local_161);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_160);
  uVar3 = *pmVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_188,"recolor",&local_189);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x10])
            (this,(ulong)GVar2,0x92e1,(ulong)uVar3,local_188,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"repos",&local_1b1);
  uVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                     local_14,"repos");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)GVar2,0x92e1,local_1b0,(ulong)uVar3,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d8,"recolor",&local_1d9);
  uVar3 = glu::CallLogWrapper::glGetUniformLocation
                    (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                     local_14,"recolor");
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x11])
            (this,(ulong)GVar2,0x92e1,local_1d8,(ulong)uVar3,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  props[6] = 0x9301;
  props[7] = 0x930b;
  props[8] = 0x930a;
  props[9] = 0x9306;
  props[2] = 0x92fd;
  props[3] = 0x92fe;
  props[4] = 0x92ff;
  props[5] = 0x9300;
  uStack_218 = 0x92fa000092f9;
  props[0] = 0x92fb;
  props[1] = 0x92fc;
  props[10] = 0x930e;
  local_258 = 6;
  local_254 = 0x8b52;
  expected[0] = 1;
  expected[1] = -1;
  expected[2] = -1;
  expected[3] = -1;
  expected[4] = -1;
  expected[5] = 0;
  expected[6] = -1;
  expected[7] = 0;
  expected[8] = 0;
  expected[9] = 1;
  expected[10] = glu::CallLogWrapper::glGetUniformLocation
                           (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.
                             super_CallLogWrapper,local_14,"repos");
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"repos",&local_279);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_278);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)GVar2,0x92e1,(ulong)*pmVar4,0xd,&uStack_218,0xd,&local_258,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  local_2b8 = 8;
  local_2b4 = 0x8b52;
  expected2[0] = 1;
  expected2[1] = -1;
  expected2[2] = -1;
  expected2[3] = -1;
  expected2[4] = -1;
  expected2[5] = 0;
  expected2[6] = -1;
  expected2[7] = 0;
  expected2[8] = 1;
  expected2[9] = 0;
  expected2[10] =
       glu::CallLogWrapper::glGetUniformLocation
                 (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,
                  local_14,"recolor");
  GVar2 = local_14;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"recolor",&local_2d9);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                         *)local_a0,&local_2d8);
  (*(this->super_PIQBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x13])
            (this,(ulong)GVar2,0x92e1,(ulong)*pmVar4,0xd,&uStack_218,0xd,&local_2b8,
             &indices._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_PIQBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,local_14)
  ;
  sVar1 = indices._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          *)local_a0);
  return sVar1;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		LinkProgram(program);

		long error = NO_ERROR;

		VerifyGetProgramInterfaceiv(program, GL_UNIFORM, GL_ACTIVE_RESOURCES,
									GetProgramivRetValue(program, GL_ACTIVE_UNIFORMS), error);
		VerifyGetProgramInterfaceiv(program, GL_UNIFORM, GL_MAX_NAME_LENGTH, 8, error);

		std::map<std::string, GLuint> indices;
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "repos", error);
		VerifyGetProgramResourceIndex(program, GL_UNIFORM, indices, "recolor", error);

		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["repos"], "repos", error);
		VerifyGetProgramResourceName(program, GL_UNIFORM, indices["recolor"], "recolor", error);

		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "repos", glGetUniformLocation(program, "repos"), error);
		VerifyGetProgramResourceLocation(program, GL_UNIFORM, "recolor", glGetUniformLocation(program, "recolor"),
										 error);

		GLenum props[] = { GL_NAME_LENGTH,
						   GL_TYPE,
						   GL_ARRAY_SIZE,
						   GL_OFFSET,
						   GL_BLOCK_INDEX,
						   GL_ARRAY_STRIDE,
						   GL_MATRIX_STRIDE,
						   GL_IS_ROW_MAJOR,
						   GL_ATOMIC_COUNTER_BUFFER_INDEX,
						   GL_REFERENCED_BY_COMPUTE_SHADER,
						   GL_REFERENCED_BY_FRAGMENT_SHADER,
						   GL_REFERENCED_BY_VERTEX_SHADER,
						   GL_LOCATION };
		GLint expected[] = { 6, 35666, 1, -1, -1, -1, -1, 0, -1, 0, 0, 1, glGetUniformLocation(program, "repos") };
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["repos"], 13, props, 13, expected, error);

		GLint expected2[] = { 8, 35666, 1, -1, -1, -1, -1, 0, -1, 0, 1, 0, glGetUniformLocation(program, "recolor") };
		VerifyGetProgramResourceiv(program, GL_UNIFORM, indices["recolor"], 13, props, 13, expected2, error);

		glDeleteProgram(program);
		return error;
	}